

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathParserContextPtr ctxt_00;
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlNodePtr local_98;
  xmlNodePtr rend;
  xmlXPathObjectPtr pxStack_88;
  int rindx;
  xmlXPathObjectPtr tmp;
  int local_78;
  int num;
  int pos;
  int found;
  xmlXPathObjectPtr number;
  xmlXPathObjectPtr position;
  xmlXPathObjectPtr string;
  xmlLocationSetPtr newset;
  xmlLocationSetPtr oldset;
  xmlXPathObjectPtr set;
  xmlNodePtr fend;
  xmlNodePtr end;
  xmlNodePtr start;
  int local_20;
  int fendindex;
  int endindex;
  int startindex;
  int i;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  local_20 = 0;
  fend = (xmlNodePtr)0x0;
  oldset = (xmlLocationSetPtr)0x0;
  string = (xmlXPathObjectPtr)0x0;
  position = (xmlXPathObjectPtr)0x0;
  number = (xmlXPathObjectPtr)0x0;
  _pos = (xmlXPathObjectPtr)0x0;
  local_78 = 0;
  tmp._4_4_ = 0;
  startindex = nargs;
  _i = ctxt;
  if ((nargs < 2) || (4 < nargs)) {
    xmlXPathErr(ctxt,0xc);
    return;
  }
  if (3 < nargs) {
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathErr(ctxt,0xb);
      goto LAB_002723b4;
    }
    _pos = valuePop(ctxt);
    if (_pos != (xmlXPathObjectPtr)0x0) {
      tmp._4_4_ = (int)_pos->floatval;
    }
  }
  if (2 < startindex) {
    if ((_i->value == (xmlXPathObjectPtr)0x0) || (_i->value->type != XPATH_NUMBER)) {
      xmlXPathErr(_i,0xb);
      goto LAB_002723b4;
    }
    number = valuePop(_i);
    if (number != (xmlXPathObjectPtr)0x0) {
      local_78 = (int)number->floatval;
    }
  }
  if ((_i->value == (xmlXPathObjectPtr)0x0) || (_i->value->type != XPATH_STRING)) {
    xmlXPathErr(_i,0xb);
  }
  else {
    position = valuePop(_i);
    if ((_i->value == (xmlXPathObjectPtr)0x0) ||
       ((_i->value->type != XPATH_LOCATIONSET && (_i->value->type != XPATH_NODESET)))) {
      xmlXPathErr(_i,0xb);
    }
    else {
      oldset = (xmlLocationSetPtr)valuePop(_i);
      string = (xmlXPathObjectPtr)xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
      if (string == (xmlXPathObjectPtr)0x0) {
        xmlXPathErr(_i,0xf);
      }
      else if (oldset->locTab != (xmlXPathObjectPtr *)0x0) {
        if (oldset->locNr == 1) {
          pxStack_88 = xmlXPtrNewLocationSetNodeSet((xmlNodeSetPtr)oldset->locTab);
          xmlXPathFreeObject((xmlXPathObjectPtr)oldset);
          if (pxStack_88 == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(_i,0xf);
            goto LAB_002723b4;
          }
          oldset = (xmlLocationSetPtr)pxStack_88;
        }
        newset = (xmlLocationSetPtr)oldset[2].locTab;
        for (endindex = 0; endindex < newset->locNr; endindex = endindex + 1) {
          xmlXPtrGetStartPoint(newset->locTab[endindex],&end,&fendindex);
          xmlXPtrGetEndPoint(newset->locTab[endindex],&fend,&local_20);
          xmlXPtrAdvanceChar(&end,&fendindex,0);
          xmlXPtrGetLastChar(&fend,&local_20);
          do {
            set = (xmlXPathObjectPtr)fend;
            start._4_4_ = local_20;
            num = xmlXPtrSearchString(position->stringval,&end,&fendindex,(xmlNodePtr *)&set,
                                      (int *)((long)&start + 4));
            pxVar3 = string;
            if (num == 1) {
              if (number == (xmlXPathObjectPtr)0x0) {
                pxVar2 = xmlXPtrNewRange(end,fendindex,(xmlNodePtr)set,start._4_4_);
                xmlXPtrLocationSetAdd((xmlLocationSetPtr)pxVar3,pxVar2);
              }
              else {
                iVar1 = xmlXPtrAdvanceChar(&end,&fendindex,local_78 + -1);
                pxVar3 = string;
                if (iVar1 == 0) {
                  if ((_pos == (xmlXPathObjectPtr)0x0) || (tmp._4_4_ < 1)) {
                    if ((_pos == (xmlXPathObjectPtr)0x0) || (0 < tmp._4_4_)) {
                      pxVar2 = xmlXPtrNewRange(end,fendindex,(xmlNodePtr)set,start._4_4_);
                      xmlXPtrLocationSetAdd((xmlLocationSetPtr)pxVar3,pxVar2);
                    }
                    else {
                      pxVar2 = xmlXPtrNewRange(end,fendindex,end,fendindex);
                      xmlXPtrLocationSetAdd((xmlLocationSetPtr)pxVar3,pxVar2);
                    }
                  }
                  else {
                    local_98 = end;
                    rend._4_4_ = fendindex + -1;
                    iVar1 = xmlXPtrAdvanceChar(&local_98,(int *)((long)&rend + 4),tmp._4_4_);
                    pxVar3 = string;
                    if (iVar1 == 0) {
                      pxVar2 = xmlXPtrNewRange(end,fendindex,local_98,rend._4_4_);
                      xmlXPtrLocationSetAdd((xmlLocationSetPtr)pxVar3,pxVar2);
                    }
                  }
                }
              }
              end = (xmlNodePtr)set;
              fendindex = start._4_4_;
              if (*position->stringval == '\0') {
                fendindex = start._4_4_ + 1;
              }
            }
          } while (num == 1);
        }
      }
    }
  }
LAB_002723b4:
  ctxt_00 = _i;
  if (string != (xmlXPathObjectPtr)0x0) {
    pxVar3 = xmlXPtrWrapLocationSet((xmlLocationSetPtr)string);
    valuePush(ctxt_00,pxVar3);
  }
  xmlXPathFreeObject((xmlXPathObjectPtr)oldset);
  xmlXPathFreeObject(position);
  if (number != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(number);
  }
  if (_pos != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(_pos);
  }
  return;
}

Assistant:

static void
xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i, startindex, endindex = 0, fendindex;
    xmlNodePtr start, end = 0, fend;
    xmlXPathObjectPtr set = NULL;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset = NULL;
    xmlXPathObjectPtr string = NULL;
    xmlXPathObjectPtr position = NULL;
    xmlXPathObjectPtr number = NULL;
    int found, pos = 0, num = 0;

    /*
     * Grab the arguments
     */
    if ((nargs < 2) || (nargs > 4))
	XP_ERROR(XPATH_INVALID_ARITY);

    if (nargs >= 4) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	number = valuePop(ctxt);
	if (number != NULL)
	    num = (int) number->floatval;
    }
    if (nargs >= 3) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	position = valuePop(ctxt);
	if (position != NULL)
	    pos = (int) position->floatval;
    }
    if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_STRING)) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    string = valuePop(ctxt);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET))) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    set = valuePop(ctxt);
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
        xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
        goto error;
    }
    if (set->nodesetval == NULL) {
        goto error;
    }
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL) {
            xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
            goto error;
        }
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to search for each element in the location set
     * the list of location set corresponding to that search
     */
    for (i = 0;i < oldset->locNr;i++) {
#ifdef DEBUG_RANGES
	xmlXPathDebugDumpObject(stdout, oldset->locTab[i], 0);
#endif

	xmlXPtrGetStartPoint(oldset->locTab[i], &start, &startindex);
	xmlXPtrGetEndPoint(oldset->locTab[i], &end, &endindex);
	xmlXPtrAdvanceChar(&start, &startindex, 0);
	xmlXPtrGetLastChar(&end, &endindex);

#ifdef DEBUG_RANGES
	xmlGenericError(xmlGenericErrorContext,
		"from index %d of ->", startindex);
	xmlDebugDumpString(stdout, start->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
	xmlGenericError(xmlGenericErrorContext,
		"to index %d of ->", endindex);
	xmlDebugDumpString(stdout, end->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
#endif
	do {
            fend = end;
            fendindex = endindex;
	    found = xmlXPtrSearchString(string->stringval, &start, &startindex,
		                        &fend, &fendindex);
	    if (found == 1) {
		if (position == NULL) {
		    xmlXPtrLocationSetAdd(newset,
			 xmlXPtrNewRange(start, startindex, fend, fendindex));
		} else if (xmlXPtrAdvanceChar(&start, &startindex,
			                      pos - 1) == 0) {
		    if ((number != NULL) && (num > 0)) {
			int rindx;
			xmlNodePtr rend;
			rend = start;
			rindx = startindex - 1;
			if (xmlXPtrAdvanceChar(&rend, &rindx,
				               num) == 0) {
			    xmlXPtrLocationSetAdd(newset,
					xmlXPtrNewRange(start, startindex,
							rend, rindx));
			}
		    } else if ((number != NULL) && (num <= 0)) {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    start, startindex));
		    } else {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    fend, fendindex));
		    }
		}
		start = fend;
		startindex = fendindex;
		if (string->stringval[0] == 0)
		    startindex++;
	    }
	} while (found == 1);
    }

    /*
     * Save the new value and cleanup
     */
error:
    if (newset != NULL)
        valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
    xmlXPathFreeObject(string);
    if (position) xmlXPathFreeObject(position);
    if (number) xmlXPathFreeObject(number);
}